

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

Shift __thiscall
dg::vr::RelationsAnalyzer::getShift
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms)

{
  Shift SVar1;
  bool bVar2;
  VRInstruction *this_00;
  Value *this_01;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RDX;
  Shift current;
  Value *what;
  StoreInst *store;
  V inst;
  VRLocation *loc;
  __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
  it;
  Shift shift;
  __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
  in_stack_ffffffffffffff88;
  uint i;
  undefined4 in_stack_ffffffffffffff90;
  Shift in_stack_ffffffffffffff94;
  Value *in_stack_ffffffffffffff98;
  __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
  local_30;
  Shift local_24;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *local_20;
  
  local_24 = EQ;
  local_20 = in_RDX;
  std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::begin
            ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
             in_stack_ffffffffffffff88._M_current);
  local_30 = std::
             next<__gnu_cxx::__normal_iterator<dg::vr::VRLocation_const*const*,std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>>>
                       (in_stack_ffffffffffffff88,0x1ce419);
  while( true ) {
    std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::end
              ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
               in_stack_ffffffffffffff88._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
                        *)in_stack_ffffffffffffff88._M_current);
    i = (uint)((ulong)in_stack_ffffffffffffff88._M_current >> 0x20);
    if (!bVar2) {
      return local_24;
    }
    __gnu_cxx::
    __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
    ::operator*(&local_30);
    VRLocation::getPredEdge
              ((VRLocation *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i);
    this_00 = (VRInstruction *)
              std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                        ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1ce46f);
    VRInstruction::getInstruction(this_00);
    llvm::cast<llvm::StoreInst,llvm::Value_const>((Value *)0x1ce486);
    in_stack_ffffffffffffff88._M_current = (VRLocation **)local_20;
    this_01 = llvm::StoreInst::getPointerOperand((StoreInst *)0x1ce49e);
    bVar2 = VectorSet<llvm::Value_const*>::contains<llvm::Value_const*>
                      ((VectorSet<const_llvm::Value_*> *)this_01,(Value **)in_stack_ffffffffffffff98
                      );
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      return UNKNOWN;
    }
    in_stack_ffffffffffffff98 = llvm::StoreInst::getValueOperand((StoreInst *)0x1ce4cd);
    in_stack_ffffffffffffff94 =
         getShift(in_stack_ffffffffffffff98,
                  (VectorSet<const_llvm::Value_*> *)
                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (local_24 == UNKNOWN) {
      return UNKNOWN;
    }
    SVar1 = in_stack_ffffffffffffff94;
    if ((local_24 != EQ) && (SVar1 = local_24, local_24 != in_stack_ffffffffffffff94)) break;
    local_24 = SVar1;
    __gnu_cxx::
    __normal_iterator<const_dg::vr::VRLocation_*const_*,_std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>_>
    ::operator++(&local_30);
  }
  return UNKNOWN;
}

Assistant:

RelationsAnalyzer::Shift RelationsAnalyzer::getShift(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms) const {
    Shift shift = Shift::EQ;
    // first location is the tree predecessor
    for (auto it = std::next(changeLocations.begin());
         it != changeLocations.end(); ++it) {
        const VRLocation *loc = *it;
        assert(loc->predsSize() == 1);

        V inst = static_cast<VRInstruction *>(loc->getPredEdge(0)->op.get())
                         ->getInstruction();
        assert(inst);
        assert(llvm::isa<llvm::StoreInst>(inst));
        const llvm::StoreInst *store = llvm::cast<llvm::StoreInst>(inst);
        if (!froms.contains(store->getPointerOperand()))
            return Shift::UNKNOWN;

        const auto *what = store->getValueOperand();

        Shift current = getShift(what, froms);

        if (shift == Shift::UNKNOWN)
            return shift;
        if (shift == Shift::EQ)
            shift = current;
        else if (shift != current)
            return Shift::UNKNOWN;
    }
    return shift;
}